

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O3

mz_bool mz_zip_writer_add_cfile
                  (mz_zip_archive *pZip,char *pArchive_name,FILE *pSrc_file,mz_uint64 size_to_add,
                  time_t *pFile_time,void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  char *user_extra_data,mz_uint user_extra_data_len,char *user_extra_data_central,
                  mz_uint user_extra_data_central_len)

{
  mz_zip_internal_state *pmVar1;
  bool bVar2;
  mz_uint16 filename_size;
  mz_uint16 dos_time_00;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined4 uVar5;
  mz_bool mVar6;
  mz_uint32 mVar7;
  tdefl_status tVar8;
  mz_uint32 mVar9;
  size_t sVar10;
  mz_uint64 *pmVar11;
  size_t sVar12;
  mz_uint8 *ptr;
  tdefl_compressor *d;
  size_t sVar13;
  mz_ulong crc;
  mz_uint64 mVar14;
  size_t sVar15;
  uint uVar16;
  tdefl_flush flush;
  mz_zip_error mVar17;
  char *pcVar18;
  mz_uint64 *pLocal_header_ofs;
  mz_uint64 *pmVar19;
  char cVar20;
  mz_uint64 *pmVar21;
  mz_uint8 *pBuf;
  int iVar22;
  int iVar23;
  ulong uVar24;
  mz_uint64 mVar25;
  mz_uint64 mVar26;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  undefined8 local_118;
  mz_uint64 comp_size;
  mz_uint64 uncomp_size;
  uint local_fc;
  mz_zip_writer_add_state state;
  mz_uint16 local_c4;
  size_t local_b8;
  mz_uint64 local_dir_header_ofs;
  int local_9c;
  undefined1 local_98 [5];
  undefined2 uStack_93;
  undefined1 uStack_91;
  undefined1 uStack_90;
  undefined1 uStack_8f;
  undefined1 uStack_8e;
  undefined1 uStack_8d;
  undefined1 uStack_8c;
  undefined1 uStack_8b;
  undefined2 uStack_8a;
  undefined6 uStack_88;
  long lStack_82;
  undefined1 *local_78;
  FILE *local_70;
  ulong local_68;
  void *local_60;
  mz_uint8 extra_data [28];
  
  dos_time = 0;
  dos_date = 0;
  mVar25 = pZip->m_archive_size;
  comp_size = 0;
  uVar16 = 6;
  if (-1 < (int)level_and_flags) {
    uVar16 = level_and_flags;
  }
  pmVar1 = pZip->m_pState;
  if ((((pmVar1 == (mz_zip_internal_state *)0x0) || (pArchive_name == (char *)0x0)) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) ||
     (pComment == (void *)0x0 && comment_size != 0 || 10 < (uVar16 & 0xf))) {
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  local_118 = CONCAT44(local_118._4_4_,uVar16) & 0xffffffff0000000f;
  iVar23 = pmVar1->m_zip64;
  if (size_to_add >> 0x20 != 0 && iVar23 == 0) {
    pmVar1->m_zip64 = 1;
    iVar23 = 1;
  }
  if ((uVar16 >> 10 & 1) != 0) {
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  cVar20 = *pArchive_name;
  if (cVar20 == '/') {
LAB_0010b05c:
    pZip->m_last_error = MZ_ZIP_INVALID_FILENAME;
    return 0;
  }
  local_fc = (uint)((level_and_flags >> 0x10 & 1) == 0) << 0xb | 8;
  local_78 = (undefined1 *)((long)&state.m_cur_archive_file_ofs + 7);
  pcVar18 = pArchive_name + 1;
  while (cVar20 != '\0') {
    if ((cVar20 == ':') || (cVar20 == '\\')) {
      if (pZip == (mz_zip_archive *)0x0) {
        return 0;
      }
      goto LAB_0010b05c;
    }
    cVar20 = *pcVar18;
    pcVar18 = pcVar18 + 1;
  }
  if (iVar23 == 0) {
    bVar2 = true;
    if (pZip->m_total_files == 0xffff) {
      pmVar1->m_zip64 = 1;
      bVar2 = false;
    }
  }
  else {
    bVar2 = false;
    if (pZip->m_total_files == 0xffffffff) {
      pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
      return 0;
    }
  }
  uncomp_size = size_to_add;
  local_70 = (FILE *)pSrc_file;
  local_60 = pComment;
  sVar10 = strlen(pArchive_name);
  if (0xffff < sVar10) goto LAB_0010b05c;
  iVar23 = (int)pZip->m_file_offset_alignment;
  uVar16 = iVar23 - 1;
  uVar24 = (ulong)(iVar23 - (uVar16 & (uint)mVar25) & uVar16);
  if (pZip->m_file_offset_alignment == 0) {
    uVar24 = 0;
  }
  sVar12 = (pmVar1->m_central_dir).m_size;
  local_68 = (ulong)comment_size;
  if (0xfffffffe < sVar10 + local_68 + sVar12 + 0x4a) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
    return 0;
  }
  if ((bVar2) &&
     (uVar24 + user_extra_data_len + local_68 + (ulong)user_extra_data_central_len + mVar25 +
               sVar10 * 2 + sVar12 + 0x472 >> 0x20 != 0)) {
    pmVar1->m_zip64 = 1;
  }
  if (pFile_time != (time_t *)0x0) {
    mz_zip_time_t_to_dos_time(*pFile_time,&dos_time,&dos_date);
    size_to_add = uncomp_size;
  }
  uVar5 = (uint)local_118;
  if (size_to_add < 4) {
    uVar5 = 0;
  }
  local_118 = CONCAT44(local_118._4_4_,uVar5);
  mVar6 = mz_zip_writer_write_zeros(pZip,mVar25,(mz_uint32)uVar24);
  dos_time_00 = dos_time;
  if (mVar6 == 0) {
    pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
    return 0;
  }
  uVar24 = mVar25 + uVar24;
  local_dir_header_ofs = uVar24;
  if ((pZip->m_file_offset_alignment != 0) && ((pZip->m_file_offset_alignment - 1 & uVar24) != 0)) {
    __assert_fail("(cur_archive_file_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cpuimage[P]DCT_8X8/miniz.c"
                  ,0x18ff,
                  "mz_bool mz_zip_writer_add_cfile(mz_zip_archive *, const char *, FILE *, mz_uint64, const time_t *, const void *, mz_uint16, mz_uint, const char *, mz_uint, const char *, mz_uint)"
                 );
  }
  iVar23 = (uint)((uint)local_118 != 0) << 3;
  uStack_88 = 0;
  lStack_82 = 0;
  _local_98 = 0;
  uStack_90 = 0;
  uStack_8f = 0;
  uStack_8e = 0;
  uStack_8d = 0;
  uStack_8c = 0;
  uStack_8b = 0;
  uStack_8a = 0;
  uVar4 = (undefined1)(local_fc >> 8);
  filename_size = (mz_uint16)sVar10;
  if (pmVar1->m_zip64 == 0) {
    if ((comp_size._4_4_ != 0) || (uVar24 >> 0x20 != 0)) goto LAB_0010b6bb;
    uVar3 = 0x14;
    if ((uint)local_118 == 0) {
      uVar3 = 0;
    }
    local_98 = (undefined1  [5])CONCAT14(uVar3,0x4034b50);
    _local_98 = CONCAT16(8,CONCAT15(0,local_98));
    _local_98 = CONCAT17(uVar4,_local_98);
    uStack_8e = (undefined1)dos_time;
    uStack_8d = (undefined1)(dos_time >> 8);
    uStack_8c = (undefined1)dos_date;
    local_c4 = dos_date;
    uStack_8b = (undefined1)(dos_date >> 8);
    uStack_8a = 0;
    uStack_88 = 0;
    lStack_82 = (ulong)CONCAT13((char)(user_extra_data_len >> 8),
                                CONCAT12((char)user_extra_data_len,filename_size)) << 0x20;
    uStack_90 = (char)iVar23;
    sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar24,local_98,0x1e);
    if (sVar12 != 0x1e) goto LAB_0010b591;
    sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar24 + 0x1e,pArchive_name,sVar10);
    if (sVar12 != sVar10) goto LAB_0010b591;
    mVar25 = uVar24 + 0x1e + sVar10;
    pBuf = (mz_uint8 *)0x0;
    local_b8 = 0;
  }
  else {
    if ((size_to_add < 0xffffffff) && (uVar24 < 0xffffffff)) {
      pBuf = (mz_uint8 *)0x0;
      local_b8 = 0;
    }
    else {
      pmVar11 = (mz_uint64 *)0x0;
      pmVar19 = &uncomp_size;
      if (size_to_add < 0xffffffff) {
        pmVar19 = pmVar11;
      }
      pmVar21 = &comp_size;
      if (size_to_add < 0xffffffff) {
        pmVar21 = pmVar11;
      }
      pLocal_header_ofs = &local_dir_header_ofs;
      if (uVar24 < 0xffffffff) {
        pLocal_header_ofs = pmVar11;
      }
      pBuf = extra_data;
      mVar7 = mz_zip_writer_create_zip64_extra_data(pBuf,pmVar19,pmVar21,pLocal_header_ofs);
      uVar4 = (undefined1)(local_fc >> 8);
      local_b8 = (size_t)mVar7;
    }
    dos_time_00 = dos_time;
    iVar22 = (int)local_b8 + user_extra_data_len;
    uVar3 = 0x14;
    if ((uint)local_118 == 0) {
      uVar3 = 0;
    }
    local_98 = (undefined1  [5])CONCAT14(uVar3,0x4034b50);
    _local_98 = CONCAT25(0x800,local_98);
    _local_98 = CONCAT17(uVar4,_local_98);
    uStack_8f = 0;
    uStack_8e = (undefined1)dos_time;
    uStack_8d = (undefined1)(dos_time >> 8);
    uStack_8c = (undefined1)dos_date;
    local_c4 = dos_date;
    uStack_8b = (undefined1)(dos_date >> 8);
    uStack_8a = 0;
    uStack_88 = 0;
    lStack_82 = (ulong)CONCAT13((char)((uint)iVar22 >> 8),CONCAT12((char)iVar22,filename_size)) <<
                0x20;
    uStack_90 = (char)iVar23;
    sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar24,local_98,0x1e);
    if (sVar12 != 0x1e) goto LAB_0010b591;
    sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar24 + 0x1e,pArchive_name,sVar10);
    if (sVar12 != sVar10) goto LAB_0010b591;
    mVar25 = uVar24 + 0x1e + sVar10;
    sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar25,extra_data,local_b8);
    if (sVar12 != local_b8) goto LAB_0010b591;
    mVar25 = mVar25 + local_b8;
  }
  local_9c = iVar23;
  if (user_extra_data_len != 0) {
    uVar24 = (ulong)user_extra_data_len;
    sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar25,user_extra_data,uVar24);
    if (sVar12 != uVar24) {
LAB_0010b591:
      pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      return 0;
    }
    mVar25 = mVar25 + uVar24;
  }
  mVar26 = uncomp_size;
  if (uncomp_size == 0) {
    mVar7 = 0;
  }
  else {
    ptr = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x10000);
    if (ptr == (mz_uint8 *)0x0) {
LAB_0010b6e7:
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      return 0;
    }
    if ((uint)local_118 == 0) {
      crc = 0;
      do {
        sVar10 = 0x10000;
        if (mVar26 < 0x10000) {
          sVar10 = mVar26;
        }
        sVar13 = fread(ptr,1,sVar10,local_70);
        if ((sVar13 != sVar10) ||
           (sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar25,ptr,sVar10), sVar12 != sVar10)) {
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
          pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
          return 0;
        }
        crc = mz_crc32(crc,ptr,sVar10);
        mVar25 = mVar25 + sVar10;
        mVar26 = mVar26 - sVar10;
        mVar14 = uncomp_size;
      } while (mVar26 != 0);
    }
    else {
      d = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
      if (d == (tdefl_compressor *)0x0) {
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
        goto LAB_0010b6e7;
      }
      uVar24 = 10;
      if ((uint)local_118 < 10) {
        uVar24 = local_118 & 0xffffffff;
      }
      state.m_comp_size = 0;
      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = mVar25;
      tdefl_init(d,mz_zip_writer_add_put_buf_callback,&state,
                 (uint)((uint)local_118 < 4) << 0xe |
                 tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar24]);
      crc = 0;
      do {
        sVar10 = 0x10000;
        if (mVar26 < 0x10000) {
          sVar10 = mVar26;
        }
        sVar13 = fread(ptr,1,sVar10,local_70);
        if (sVar13 != sVar10) {
          mVar17 = MZ_ZIP_FILE_READ_FAILED;
          goto LAB_0010b825;
        }
        crc = mz_crc32(crc,ptr,sVar10);
        if (pZip->m_pNeeds_keepalive == (mz_file_needs_keepalive)0x0) {
          flush = TDEFL_NO_FLUSH;
        }
        else {
          mVar6 = (*pZip->m_pNeeds_keepalive)(pZip->m_pIO_opaque);
          flush = (uint)(mVar6 != 0) * 3;
        }
        mVar26 = mVar26 - sVar10;
        if (mVar26 == 0) {
          flush = TDEFL_FINISH;
        }
        tVar8 = tdefl_compress_buffer(d,ptr,sVar10,flush);
      } while (tVar8 == TDEFL_STATUS_OKAY);
      mVar17 = MZ_ZIP_COMPRESSION_FAILED;
      if (tVar8 != TDEFL_STATUS_DONE) {
LAB_0010b825:
        pZip->m_last_error = mVar17;
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,d);
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
        return 0;
      }
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,d);
      mVar14 = state.m_comp_size;
      mVar25 = state.m_cur_archive_file_ofs;
    }
    mVar7 = (mz_uint32)crc;
    comp_size = mVar14;
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
  }
  mVar26 = state.m_cur_archive_file_ofs;
  state.m_pZip = (mz_zip_archive *)
                 CONCAT17((char)(mVar7 >> 0x18),
                          CONCAT16((char)(mVar7 >> 0x10),
                                   CONCAT15((char)(mVar7 >> 8),CONCAT14((char)mVar7,0x8074b50))));
  uVar4 = (undefined1)(uncomp_size >> 0x18);
  if (pBuf == (mz_uint8 *)0x0) {
    if (comp_size >> 0x20 != 0) {
LAB_0010b6bb:
      pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      return 0;
    }
    state.m_cur_archive_file_ofs._7_1_ = SUB81(mVar26,7);
    state.m_cur_archive_file_ofs._0_7_ =
         CONCAT16((char)(uncomp_size >> 0x10),
                  CONCAT15((char)(uncomp_size >> 8),CONCAT14((char)uncomp_size,(int)comp_size)));
    sVar12 = 0x10;
  }
  else {
    state.m_cur_archive_file_ofs = comp_size;
    state.m_comp_size._0_7_ = (undefined7)uncomp_size;
    uVar4 = (undefined1)(uncomp_size >> 0x38);
    sVar12 = 0x18;
    local_78 = (undefined1 *)((long)&state.m_comp_size + 7);
  }
  *local_78 = uVar4;
  sVar15 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar25,&state,sVar12);
  if (sVar15 != sVar12) {
    return 0;
  }
  if (pBuf != (mz_uint8 *)0x0) {
    pmVar19 = (mz_uint64 *)0x0;
    pmVar11 = &uncomp_size;
    if (uncomp_size < 0xffffffff) {
      pmVar11 = pmVar19;
    }
    pmVar21 = &comp_size;
    if (uncomp_size < 0xffffffff) {
      pmVar21 = pmVar19;
    }
    if (0xfffffffe < local_dir_header_ofs) {
      pmVar19 = &local_dir_header_ofs;
    }
    mVar9 = mz_zip_writer_create_zip64_extra_data(extra_data,pmVar11,pmVar21,pmVar19);
    local_b8._0_2_ = (mz_uint16)mVar9;
  }
  local_118 = (ulong)(ushort)local_9c;
  mVar6 = mz_zip_writer_add_to_central_dir
                    (pZip,pArchive_name,filename_size,pBuf,(mz_uint16)local_b8,local_60,
                     (mz_uint16)local_68,uncomp_size,comp_size,mVar7,(ushort)local_9c,
                     (mz_uint16)local_fc,dos_time_00,local_c4,local_dir_header_ofs,0,
                     user_extra_data_central,user_extra_data_central_len);
  if (mVar6 != 0) {
    pZip->m_total_files = pZip->m_total_files + 1;
    pZip->m_archive_size = sVar12 + mVar25;
    return 1;
  }
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_cfile(mz_zip_archive *pZip, const char *pArchive_name, MZ_FILE *pSrc_file, mz_uint64 size_to_add, const MZ_TIME_T *pFile_time, const void *pComment, mz_uint16 comment_size, mz_uint level_and_flags,
                                const char *user_extra_data, mz_uint user_extra_data_len, const char *user_extra_data_central, mz_uint user_extra_data_central_len)
{
    mz_uint16 gen_flags = MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR;
    mz_uint uncomp_crc32 = MZ_CRC32_INIT, level, num_alignment_padding_bytes;
    mz_uint16 method = 0, dos_time = 0, dos_date = 0, ext_attributes = 0;
    mz_uint64 local_dir_header_ofs, cur_archive_file_ofs = pZip->m_archive_size, uncomp_size = size_to_add, comp_size = 0;
    size_t archive_name_size;
    mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
    mz_uint8 *pExtra_data = NULL;
    mz_uint32 extra_size = 0;
    mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
    mz_zip_internal_state *pState;

    if (!(level_and_flags & MZ_ZIP_FLAG_ASCII_FILENAME))
        gen_flags |= MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8;

    if ((int)level_and_flags < 0)
        level_and_flags = MZ_DEFAULT_LEVEL;
    level = level_and_flags & 0xF;

    /* Sanity checks */
    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pArchive_name) || ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    if ((!pState->m_zip64) && (uncomp_size > MZ_UINT32_MAX))
    {
        /* Source file is too large for non-zip64 */
        /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        pState->m_zip64 = MZ_TRUE;
    }

    /* We could support this, but why? */
    if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_writer_validate_archive_name(pArchive_name))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

    if (pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES); */
        }
    }

    archive_name_size = strlen(pArchive_name);
    if (archive_name_size > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
    if (((mz_uint64)pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE + comment_size) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    if (!pState->m_zip64)
    {
        /* Bail early if the archive would obviously become too large */
        if ((pZip->m_archive_size + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + archive_name_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE 
			+ archive_name_size + comment_size + user_extra_data_len + pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 1024
			+ MZ_ZIP_DATA_DESCRIPTER_SIZE32 + user_extra_data_central_len) > 0xFFFFFFFF)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

#ifndef MINIZ_NO_TIME
    if (pFile_time)
    {
        mz_zip_time_t_to_dos_time(*pFile_time, &dos_time, &dos_date);
    }
#endif

    if (uncomp_size <= 3)
        level = 0;

    if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs, num_alignment_padding_bytes))
    {
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
    }

    cur_archive_file_ofs += num_alignment_padding_bytes;
    local_dir_header_ofs = cur_archive_file_ofs;

    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((cur_archive_file_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }

    if (uncomp_size && level)
    {
        method = MZ_DEFLATED;
    }

    MZ_CLEAR_OBJ(local_dir_header);
    if (pState->m_zip64)
    {
        if (uncomp_size >= MZ_UINT32_MAX || local_dir_header_ofs >= MZ_UINT32_MAX)
        {
            pExtra_data = extra_data;
            extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                               (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
        }

        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, extra_size + user_extra_data_len, 0, 0, 0, method, gen_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_archive_file_ofs += archive_name_size;

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, extra_data, extra_size) != extra_size)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += extra_size;
    }
    else
    {
        if ((comp_size > MZ_UINT32_MAX) || (cur_archive_file_ofs > MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, user_extra_data_len, 0, 0, 0, method, gen_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_archive_file_ofs += archive_name_size;
    }

    if (user_extra_data_len > 0)
    {
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, user_extra_data, user_extra_data_len) != user_extra_data_len)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += user_extra_data_len;
    }

    if (uncomp_size)
    {
        mz_uint64 uncomp_remaining = uncomp_size;
        void *pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, MZ_ZIP_MAX_IO_BUF_SIZE);
        if (!pRead_buf)
        {
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!level)
        {
            while (uncomp_remaining)
            {
                mz_uint n = (mz_uint)MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, uncomp_remaining);
                if ((MZ_FREAD(pRead_buf, 1, n, pSrc_file) != n) || (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pRead_buf, n) != n))
                {
                    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
                    return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
                }
                uncomp_crc32 = (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, n);
                uncomp_remaining -= n;
                cur_archive_file_ofs += n;
            }
            comp_size = uncomp_size;
        }
        else
        {
            mz_bool result = MZ_FALSE;
            mz_zip_writer_add_state state;
            tdefl_compressor *pComp = (tdefl_compressor *)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor));
            if (!pComp)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
                return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
            }

            state.m_pZip = pZip;
            state.m_cur_archive_file_ofs = cur_archive_file_ofs;
            state.m_comp_size = 0;

            if (tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state, tdefl_create_comp_flags_from_zip_params(level, -15, MZ_DEFAULT_STRATEGY)) != TDEFL_STATUS_OKAY)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
                pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
                return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);
            }

            for (;;)
            {
                size_t in_buf_size = (mz_uint32)MZ_MIN(uncomp_remaining, (mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE);
                tdefl_status status;
                tdefl_flush flush = TDEFL_NO_FLUSH;

                if (MZ_FREAD(pRead_buf, 1, in_buf_size, pSrc_file) != in_buf_size)
                {
                    mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
                    break;
                }

                uncomp_crc32 = (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, in_buf_size);
                uncomp_remaining -= in_buf_size;

                if (pZip->m_pNeeds_keepalive != NULL && pZip->m_pNeeds_keepalive(pZip->m_pIO_opaque))
                    flush = TDEFL_FULL_FLUSH;

                status = tdefl_compress_buffer(pComp, pRead_buf, in_buf_size, uncomp_remaining ? flush : TDEFL_FINISH);
                if (status == TDEFL_STATUS_DONE)
                {
                    result = MZ_TRUE;
                    break;
                }
                else if (status != TDEFL_STATUS_OKAY)
                {
                    mz_zip_set_error(pZip, MZ_ZIP_COMPRESSION_FAILED);
                    break;
                }
            }

            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);

            if (!result)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
                return MZ_FALSE;
            }

            comp_size = state.m_comp_size;
            cur_archive_file_ofs = state.m_cur_archive_file_ofs;
        }

        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
    }

    {
        mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
        mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE32;

        MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
        MZ_WRITE_LE32(local_dir_footer + 4, uncomp_crc32);
        if (pExtra_data == NULL)
        {
            if (comp_size > MZ_UINT32_MAX)
                return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

            MZ_WRITE_LE32(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE32(local_dir_footer + 12, uncomp_size);
        }
        else
        {
            MZ_WRITE_LE64(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE64(local_dir_footer + 16, uncomp_size);
            local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_footer, local_dir_footer_size) != local_dir_footer_size)
            return MZ_FALSE;

        cur_archive_file_ofs += local_dir_footer_size;
    }

    if (pExtra_data != NULL)
    {
        extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                           (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
    }

    if (!mz_zip_writer_add_to_central_dir(pZip, pArchive_name, (mz_uint16)archive_name_size, pExtra_data, extra_size, pComment, comment_size,
                                          uncomp_size, comp_size, uncomp_crc32, method, gen_flags, dos_time, dos_date, local_dir_header_ofs, ext_attributes,
                                          user_extra_data_central, user_extra_data_central_len))
        return MZ_FALSE;

    pZip->m_total_files++;
    pZip->m_archive_size = cur_archive_file_ofs;

    return MZ_TRUE;
}